

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

uint prvTidygetNextStringKey(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/language.c"
                  ,0x20f,"uint prvTidygetNextStringKey(TidyIterator *)");
  }
  p_Var2 = *iter;
  uVar1 = 0;
  p_Var3 = (TidyIterator)(ulong)tidyStringKeyListSize_array_size;
  if (p_Var2 == (TidyIterator)0x0) {
    p_Var2 = (TidyIterator)0x0;
  }
  else {
    if (tidyStringKeyListSize_array_size == 0) {
      if (language_en.messages[0].value == (ctmbstr)0x0) {
        p_Var3 = (TidyIterator)0x0;
      }
      else {
        p_Var3 = (TidyIterator)0x0;
        do {
          tidyStringKeyListSize_array_size = (int)p_Var3 + 1;
          p_Var3 = (TidyIterator)(ulong)tidyStringKeyListSize_array_size;
        } while (language_en.messages[(long)p_Var3].value != (ctmbstr)0x0);
      }
    }
    uVar1 = 0;
    if (p_Var2 <= p_Var3) {
      uVar1 = *(uint *)&language_fr.messages[(long)((long)&p_Var2[0x95]._opaque + 3)].value;
      p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    }
  }
  if ((int)p_Var3 == 0) {
    if (language_en.messages[0].value == (ctmbstr)0x0) {
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      p_Var3 = (TidyIterator)0x0;
      do {
        tidyStringKeyListSize_array_size = (int)p_Var3 + 1;
        p_Var3 = (TidyIterator)(ulong)tidyStringKeyListSize_array_size;
      } while (language_en.messages[(long)p_Var3].value != (ctmbstr)0x0);
    }
  }
  p_Var4 = (TidyIterator)0x0;
  if (p_Var2 <= p_Var3) {
    p_Var4 = p_Var2;
  }
  *iter = p_Var4;
  return uVar1;
}

Assistant:

uint TY_(getNextStringKey)( TidyIterator* iter )
{
    uint item = 0;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyStringKeyListSize() )
    {
        item = language_en.messages[ itemIndex - 1 ].key;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyStringKeyListSize() ? itemIndex : (size_t)0 );
    return item;
}